

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

Iterator __thiscall
HashSet<TestHashSetDestructor>::find
          (HashSet<TestHashSetDestructor> *this,TestHashSetDestructor *key)

{
  usize uVar1;
  usize uVar2;
  Item *local_30;
  Item *item;
  usize hashCode;
  TestHashSetDestructor *key_local;
  HashSet<TestHashSetDestructor> *this_local;
  
  if (this->data == (Item **)0x0) {
    this_local = (HashSet<TestHashSetDestructor> *)(this->_end).item;
  }
  else {
    uVar1 = TestHashSetDestructor::operator_cast_to_unsigned_long(key);
    uVar1 = hash(uVar1);
    for (local_30 = this->data[uVar1 % this->capacity]; local_30 != (Item *)0x0;
        local_30 = local_30->nextCell) {
      uVar1 = TestHashSetDestructor::operator_cast_to_unsigned_long(&local_30->key);
      uVar2 = TestHashSetDestructor::operator_cast_to_unsigned_long(key);
      if (uVar1 == uVar2) {
        Iterator::Iterator((Iterator *)&this_local,local_30);
        return (Iterator)(Item *)this_local;
      }
    }
    this_local = (HashSet<TestHashSetDestructor> *)(this->_end).item;
  }
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }